

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any.cpp
# Opt level: O2

bool __thiscall big_type::check(big_type *this)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if ((this->value)._M_string_length == 300) {
    pcVar1 = (this->value)._M_dataplus._M_p;
    if ((*pcVar1 == 'b') && (pcVar1[299] == 'b')) {
      if ((this->i_wanna_be_big[0] == 'k') && (this->i_wanna_be_big[0x32] == 'k')) {
        return true;
      }
      pcVar1 = "i_wanna_be_big[0] == \'k\' && i_wanna_be_big[50] == \'k\'";
      uStack_10 = 0x25;
    }
    else {
      pcVar1 = "value.front() == \'b\' && value.back() == \'b\'";
      uStack_10 = 0x24;
    }
  }
  else {
    pcVar1 = "value.size() == 300";
    uStack_10 = 0x23;
  }
  fprintf(_stdout,"Failed at %d:%s: %s\n",uStack_10,
          "/workspace/llm4binary/github/license_c_cmakelists/thelink2012[P]any/test_any.cpp",pcVar1)
  ;
  exit(1);
}

Assistant:

bool check()
    {
        CHECK(value.size() == 300);
        CHECK(value.front() == 'b' && value.back() == 'b');
        CHECK(i_wanna_be_big[0] == 'k' && i_wanna_be_big[50] == 'k');
        return true;
    }